

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O0

void __thiscall
QPixmapStyle::copyDescriptor(QPixmapStyle *this,ControlDescriptor source,ControlDescriptor dest)

{
  long lVar1;
  QPixmapStylePrivate *key;
  QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor> *in_RDI;
  long in_FS_OFFSET;
  QPixmapStylePrivate *d;
  QPixmapStyleDescriptor *in_stack_ffffffffffffff98;
  QPixmapStyleDescriptor *this_00;
  Data *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  key = d_func((QPixmapStyle *)0x402e9d);
  this_00 = (QPixmapStyleDescriptor *)&stack0xffffffffffffffb8;
  QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>::value
            ((QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor> *)
             in_stack_ffffffffffffffb8,(ControlDescriptor *)in_RDI);
  QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>::operator[]
            (in_RDI,(ControlDescriptor *)key);
  QPixmapStyleDescriptor::operator=(this_00,in_stack_ffffffffffffff98);
  QPixmapStyleDescriptor::~QPixmapStyleDescriptor((QPixmapStyleDescriptor *)0x402eef);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPixmapStyle::copyDescriptor(QPixmapStyle::ControlDescriptor source,
                                  QPixmapStyle::ControlDescriptor dest)
{
    Q_D(QPixmapStyle);
    d->descriptors[dest] = d->descriptors.value(source);
}